

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O3

Page * __thiscall QToolBoxPrivate::page(QToolBoxPrivate *this,int index)

{
  pointer puVar1;
  ulong uVar2;
  
  if (-1 < index) {
    puVar1 = (this->pageList).
             super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar2 = (long)(this->pageList).
                  super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
    if (index < (int)uVar2) {
      if ((uint)index < uVar2) {
        return (Page *)((_Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
                         )puVar1[(uint)index]._M_t.
                          super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
                          ._M_t).
                       super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
        ;
      }
      page();
    }
  }
  return (Page *)0x0;
}

Assistant:

QToolBoxPrivate::Page *QToolBoxPrivate::page(int index)
{
    if (index >= 0 && index < static_cast<int>(pageList.size()))
        return pageList[index].get();
    return nullptr;
}